

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Iiff(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew_00;
  char *pcVar2;
  Gia_Man_t *pNew;
  int fVerbose;
  int c;
  int fUseLuts;
  int fUseCells;
  int fUseGates;
  int nNumCuts;
  int nLutSize;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _nNumCuts = (char *)0x0;
  fUseGates = 8;
  fUseCells = 0xc;
  fUseLuts = 0;
  c = 0;
  fVerbose = 0;
  pNew._4_4_ = 0;
  Extra_UtilGetoptReset();
LAB_002b0a1c:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCgclvh");
  if (iVar1 == -1) {
    if (argc == globalUtilOptind + 1) {
      _nNumCuts = argv[globalUtilOptind];
    }
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Iiff(): There is no AIG to map.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pNew_00 = Gia_ManIiffTest(_nNumCuts,pAbc->pGia,fUseGates,fUseCells,fUseLuts,c,fVerbose,
                                pNew._4_4_);
      if (pNew_00 == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Iiff(): Mapping has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        Abc_FrameUpdateGia(pAbc,pNew_00);
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x43:
    if (globalUtilOptind < argc) {
      fUseCells = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002b0a1c;
    }
    Abc_Print(-1,"Command line switch \"-C\" should be followed by a positive integer.\n");
    break;
  default:
    break;
  case 0x4b:
    if (globalUtilOptind < argc) {
      fUseGates = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002b0a1c;
    }
    Abc_Print(-1,"Command line switch \"-K\" should be followed by a positive integer.\n");
    break;
  case 99:
    c = c ^ 1;
    goto LAB_002b0a1c;
  case 0x67:
    fUseLuts = fUseLuts ^ 1;
    goto LAB_002b0a1c;
  case 0x68:
    break;
  case 0x6c:
    fVerbose = fVerbose ^ 1;
    goto LAB_002b0a1c;
  case 0x76:
    goto switchD_002b0a62_caseD_76;
  }
  Abc_Print(-2,"usage: &iiff [-KC num] [-gclvh] <file>\n");
  Abc_Print(-2,"\t           performs techology mapping\n");
  Abc_Print(-2,"\t-K num   : the maximum LUT size [default = %d]\n",(ulong)(uint)fUseGates);
  Abc_Print(-2,"\t-C num   : the maximum cut count [default = %d]\n",(ulong)(uint)fUseCells);
  pcVar2 = "no";
  if (fUseLuts != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-g       : toggle using gates [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (c != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-c       : toggle using cells [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (fVerbose != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-l       : toggle using LUTs  [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (pNew._4_4_ != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  Abc_Print(-2,"\t<file>   : (optional) output file name\n");
  return 1;
switchD_002b0a62_caseD_76:
  pNew._4_4_ = pNew._4_4_ ^ 1;
  goto LAB_002b0a1c;
}

Assistant:

int Abc_CommandAbc9Iiff( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManIiffTest( char * pFileName, Gia_Man_t * pGia, int nLutSize, int nNumCuts, int fUseGates, int fUseCells, int fUseLuts, int fVerbose );
    char * pFileName = NULL;
    int nLutSize     =  8;
    int nNumCuts     = 12;
    int fUseGates    =  0;
    int fUseCells    =  0;
    int fUseLuts     =  0;
    int c, fVerbose  =  0;
    Gia_Man_t * pNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCgclvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nNumCuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'g':
            fUseGates ^= 1;
            break;
        case 'c':
            fUseCells ^= 1;
            break;
        case 'l':
            fUseLuts ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iiff(): There is no AIG to map.\n" );
        return 1;
    }
    pNew = Gia_ManIiffTest( pFileName, pAbc->pGia, nLutSize, nNumCuts, fUseGates, fUseCells, fUseLuts, fVerbose );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Iiff(): Mapping has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    Abc_Print( -2, "usage: &iiff [-KC num] [-gclvh] <file>\n" );
    Abc_Print( -2, "\t           performs techology mapping\n" );
    Abc_Print( -2, "\t-K num   : the maximum LUT size [default = %d]\n",  nLutSize );
    Abc_Print( -2, "\t-C num   : the maximum cut count [default = %d]\n", nNumCuts );
    Abc_Print( -2, "\t-g       : toggle using gates [default = %s]\n",    fUseGates? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle using cells [default = %s]\n",    fUseCells? "yes": "no" );
    Abc_Print( -2, "\t-l       : toggle using LUTs  [default = %s]\n",    fUseLuts? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<file>   : (optional) output file name\n");
    return 1;
}